

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O1

void __thiscall QAccessibleMenuItem::doAction(QAccessibleMenuItem *this,QString *actionName)

{
  char cVar1;
  long lVar2;
  QMenuBar *this_00;
  long lVar3;
  QMenu *this_01;
  QWidget *this_02;
  QStringView QVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  
  cVar1 = QAction::isEnabled();
  if (cVar1 != '\0') {
    lVar2 = QAccessibleActionInterface::pressAction();
    lVar3 = (actionName->d).size;
    if ((lVar3 == *(long *)(lVar2 + 0x10)) &&
       (QVar4.m_data = (actionName->d).ptr, QVar4.m_size = lVar3,
       QVar6.m_data = *(storage_type_conflict **)(lVar2 + 8), QVar6.m_size = *(long *)(lVar2 + 0x10)
       , cVar1 = QtPrivate::equalStrings(QVar4,QVar6), cVar1 != '\0')) {
      QAction::activate((ActionEvent)this->m_action);
      return;
    }
    lVar2 = QAccessibleActionInterface::showMenuAction();
    lVar3 = (actionName->d).size;
    if ((lVar3 == *(long *)(lVar2 + 0x10)) &&
       (QVar5.m_data = (actionName->d).ptr, QVar5.m_size = lVar3,
       QVar7.m_data = *(storage_type_conflict **)(lVar2 + 8), QVar7.m_size = *(long *)(lVar2 + 0x10)
       , cVar1 = QtPrivate::equalStrings(QVar5,QVar7), cVar1 != '\0')) {
      this_00 = (QMenuBar *)QMetaObject::cast((QObject *)&QMenuBar::staticMetaObject);
      if (this_00 != (QMenuBar *)0x0) {
        QAction::menuObject();
        lVar3 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (lVar3 != 0) {
          QAction::menuObject();
          lVar3 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
          if ((*(byte *)(*(long *)(lVar3 + 0x20) + 9) & 0x80) != 0) {
LAB_00523af7:
            QAction::menuObject();
            this_02 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
            QWidget::hide(this_02);
            return;
          }
        }
        QMenuBar::setActiveAction(this_00,this->m_action);
        return;
      }
      this_01 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
      if (this_01 != (QMenu *)0x0) {
        QAction::menuObject();
        lVar3 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
        if (lVar3 != 0) {
          QAction::menuObject();
          lVar3 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
          if ((*(byte *)(*(long *)(lVar3 + 0x20) + 9) & 0x80) != 0) goto LAB_00523af7;
        }
        QMenu::setActiveAction(this_01,this->m_action);
        return;
      }
    }
  }
  return;
}

Assistant:

void QAccessibleMenuItem::doAction(const QString &actionName)
{
    if (!m_action->isEnabled())
        return;

    if (actionName == pressAction()) {
        m_action->trigger();
    } else if (actionName == showMenuAction()) {
#if QT_CONFIG(menubar)
        if (QMenuBar *bar = qobject_cast<QMenuBar*>(owner())) {
            if (m_action->menu() && m_action->menu()->isVisible()) {
                m_action->menu()->hide();
            } else {
                bar->setActiveAction(m_action);
            }
        } else
#endif
          if (QMenu *menu = qobject_cast<QMenu*>(owner())){
            if (m_action->menu() && m_action->menu()->isVisible()) {
                m_action->menu()->hide();
            } else {
                menu->setActiveAction(m_action);
            }
        }
    }
}